

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomAngMomCorrFunc.cpp
# Opt level: O3

int __thiscall
OpenMD::MomAngMomCorrFunc::computeProperty1(MomAngMomCorrFunc *this,int frame,StuntDouble *sd)

{
  double *pdVar1;
  double dVar2;
  pointer pvVar3;
  uint i;
  long lVar4;
  Vector<double,_3U> result;
  double local_68 [4];
  double local_48 [4];
  Vector3<double> local_28;
  
  pvVar3 = (this->momenta_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar2 = sd->mass_;
  lVar4 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
  local_48[2] = (double)*(undefined8 *)(lVar4 + 0x10 + (long)sd->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar4 + (long)sd->localIndex_ * 0x18);
  local_48[0] = *pdVar1;
  local_48[1] = pdVar1[1];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  lVar4 = 0;
  do {
    local_68[lVar4] = local_48[lVar4] * dVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_28.super_Vector<double,_3U>.data_[2] = local_68[2];
  local_28.super_Vector<double,_3U>.data_[0] = local_68[0];
  local_28.super_Vector<double,_3U>.data_[1] = local_68[1];
  std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
  emplace_back<OpenMD::Vector3<double>>
            ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
             (pvVar3 + frame),&local_28);
  pvVar3 = (this->momenta_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)*(pointer *)
                              ((long)&pvVar3[frame].
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&pvVar3[frame].
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data) >> 3) * -0x55555555 + -1;
}

Assistant:

int MomAngMomCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    momenta_[frame].push_back(sd->getMass() * sd->getVel());
    return momenta_[frame].size() - 1;
  }